

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

int Extra_bddCountCubes(DdManager *dd,DdNode **pFuncs,int nFuncs,int fMode,int nLimit,int *pGuide)

{
  undefined4 uVar1;
  st__table *table_00;
  int local_68;
  uint saveLimit;
  st__table *table;
  int local_50;
  int CounterAll;
  int Count1;
  int Count0;
  int Count;
  int i;
  DdNode *pF1;
  DdNode *pF0;
  int *pGuide_local;
  int local_20;
  int nLimit_local;
  int fMode_local;
  int nFuncs_local;
  DdNode **pFuncs_local;
  DdManager *dd_local;
  
  table._4_4_ = 0;
  pF0 = (DdNode *)pGuide;
  pGuide_local._4_4_ = nLimit;
  local_20 = fMode;
  nLimit_local = nFuncs;
  _fMode_local = pFuncs;
  pFuncs_local = (DdNode **)dd;
  table_00 = st__init_table(st__ptrcmp,st__ptrhash);
  uVar1 = *(undefined4 *)((long)pFuncs_local + 0xf4);
  *(int *)((long)pFuncs_local + 0xf4) =
       (*(int *)((long)pFuncs_local + 0xe4) - *(int *)((long)pFuncs_local + 0xec)) + 1000000;
  for (Count0 = 0; Count0 < nLimit_local; Count0 = Count0 + 1) {
    if (_fMode_local[Count0] != (DdNode *)0x0) {
      pF1 = (DdNode *)0x0;
      _Count = (DdNode *)0x0;
      local_50 = pGuide_local._4_4_;
      CounterAll = pGuide_local._4_4_;
      if ((local_20 == -1) || (local_20 == 1)) {
        _Count = extraBddCountCubes((DdManager *)pFuncs_local,_fMode_local[Count0],
                                    _fMode_local[Count0],table_00,&local_50,pGuide_local._4_4_);
      }
      _fMode_local[Count0] = (DdNode *)((ulong)_fMode_local[Count0] ^ 1);
      if ((local_20 == -1) || (local_20 == 0)) {
        pF1 = extraBddCountCubes((DdManager *)pFuncs_local,_fMode_local[Count0],_fMode_local[Count0]
                                 ,table_00,&CounterAll,local_50);
      }
      _fMode_local[Count0] = (DdNode *)((ulong)_fMode_local[Count0] ^ 1);
      if ((_Count == (DdNode *)0x0) && (pF1 == (DdNode *)0x0)) break;
      if (pF1 == (DdNode *)0x0) {
        (&pF0->index)[Count0] = 1;
        Count1 = local_50;
      }
      else if (_Count == (DdNode *)0x0) {
        (&pF0->index)[Count0] = 0;
        Count1 = CounterAll;
      }
      else if (CounterAll < local_50) {
        (&pF0->index)[Count0] = 0;
        Count1 = CounterAll;
      }
      else {
        (&pF0->index)[Count0] = 1;
        Count1 = local_50;
      }
      table._4_4_ = Count1 + table._4_4_;
    }
  }
  *(undefined4 *)((long)pFuncs_local + 0xf4) = uVar1;
  st__free_table(table_00);
  if (Count0 == nLimit_local) {
    local_68 = table._4_4_;
  }
  else {
    local_68 = -1;
  }
  return local_68;
}

Assistant:

int Extra_bddCountCubes( DdManager * dd, DdNode ** pFuncs, int nFuncs, int fMode, int nLimit, int * pGuide )
{
    DdNode * pF0, * pF1; 
    int i, Count, Count0, Count1, CounterAll = 0;
    st__table *table = st__init_table( st__ptrcmp, st__ptrhash );
    unsigned int saveLimit = dd->maxLive;
    dd->maxLive = dd->keys - dd->dead + 1000000; // limit on intermediate BDD nodes
    for ( i = 0; i < nFuncs; i++ )
    {
        if ( !pFuncs[i] )
            continue;
        pF1 = pF0 = NULL;
        Count0 = Count1 = nLimit;
        if ( fMode == -1 || fMode == 1 ) // both or pos
            pF1 = extraBddCountCubes( dd, pFuncs[i], pFuncs[i], table, &Count1, nLimit );
        pFuncs[i] = Cudd_Not( pFuncs[i] );
        if ( fMode == -1 || fMode == 0 ) // both or neg
            pF0 = extraBddCountCubes( dd, pFuncs[i], pFuncs[i], table, &Count0, Count1 );
        pFuncs[i] = Cudd_Not( pFuncs[i] );
        if ( !pF1 && !pF0 )
            break;
        if ( !pF0 )                  pGuide[i] = 1, Count = Count1; // use pos
        else if ( !pF1 )             pGuide[i] = 0, Count = Count0; // use neg
        else if ( Count1 <= Count0 ) pGuide[i] = 1, Count = Count1; // use pos
        else                         pGuide[i] = 0, Count = Count0; // use neg
        CounterAll += Count;
        //printf( "Output %5d has %5d cubes (%d)  (%5d and %5d)\n", nOuts++, Count, pGuide[i], Count1, Count0 );
    }
    dd->maxLive = saveLimit;
    st__free_table( table );
    return i == nFuncs ? CounterAll : -1;
}